

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall aiNode::~aiNode(aiNode *this)

{
  aiNode *this_00;
  aiMetadata *this_01;
  aiNode **ppaVar1;
  uint a;
  ulong uVar2;
  
  ppaVar1 = this->mChildren;
  if (ppaVar1 != (aiNode **)0x0) {
    if (this->mNumChildren != 0) {
      uVar2 = 0;
      do {
        this_00 = this->mChildren[uVar2];
        if (this_00 != (aiNode *)0x0) {
          ~aiNode(this_00);
        }
        operator_delete(this_00);
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->mNumChildren);
      ppaVar1 = this->mChildren;
      if (ppaVar1 == (aiNode **)0x0) goto LAB_0013b613;
    }
    operator_delete__(ppaVar1);
  }
LAB_0013b613:
  if (this->mMeshes != (uint *)0x0) {
    operator_delete__(this->mMeshes);
  }
  this_01 = this->mMetaData;
  if (this_01 != (aiMetadata *)0x0) {
    aiMetadata::~aiMetadata(this_01);
  }
  operator_delete(this_01);
  return;
}

Assistant:

aiNode::~aiNode() {
    // delete all children recursively
    // to make sure we won't crash if the data is invalid ...
    if (mChildren && mNumChildren)
    {
        for (unsigned int a = 0; a < mNumChildren; a++)
            delete mChildren[a];
    }
    delete[] mChildren;
    delete[] mMeshes;
    delete mMetaData;
}